

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_instanceof(ExecutionEngine *this)

{
  bool bVar1;
  ushort index;
  int iVar2;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar3;
  cp_info **ppcVar4;
  char *pcVar5;
  ClassRuntime *this_02;
  ClassFile *pCVar6;
  anon_union_8_10_52016fac_for_data aVar7;
  bool bVar8;
  Value VVar9;
  string currClassName;
  string className;
  string superClassName;
  allocator local_99;
  MethodArea *local_98;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  string local_50;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  local_98 = MethodArea::getInstance();
  puVar3 = Frame::getCode(this_01,this_01->pc);
  index = *(ushort *)(puVar3 + 1) << 8 | *(ushort *)(puVar3 + 1) >> 8;
  ppcVar4 = Frame::getConstantPool(this_01);
  if ((*ppcVar4)[(ulong)index - 1].tag != '\a') {
    __assert_fail("cpElement.tag == CONSTANT_Class",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x11c3,"void ExecutionEngine::i_instanceof()");
  }
  pcVar5 = getFormattedConstant(*ppcVar4,index);
  std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_90);
  VVar9 = Frame::popTopOfOperandStack(this_01);
  aVar7 = VVar9.data;
  if (VVar9.type != REFERENCE) {
    __assert_fail("objectrefValue.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x11c7,"void ExecutionEngine::i_instanceof()");
  }
  if (aVar7 == (ClassInstance *)0x0) {
    aVar7.longValue = 0;
  }
  else {
    iVar2 = (**((Object *)&(aVar7.object)->_vptr_Object)->_vptr_Object)(aVar7.longValue);
    if (iVar2 == 0) {
      this_02 = ClassInstance::getClassRuntime((ClassInstance *)aVar7.object);
      bVar8 = false;
      do {
        if (bVar8) break;
        pCVar6 = ClassRuntime::getClassFile(this_02);
        pcVar5 = getFormattedConstant(pCVar6->constant_pool,pCVar6->this_class);
        std::__cxx11::string::string((string *)&local_90,pcVar5,(allocator *)&local_50);
        if (local_88 == local_68) {
          if (local_88 != 0) {
            iVar2 = bcmp(local_90,local_70,local_88);
            if (iVar2 != 0) goto LAB_00121935;
          }
          bVar8 = true;
LAB_00121984:
          bVar1 = true;
        }
        else {
LAB_00121935:
          if (pCVar6->super_class != 0) {
            pcVar5 = getFormattedConstant(pCVar6->constant_pool,pCVar6->this_class);
            std::__cxx11::string::string((string *)&local_50,pcVar5,&local_99);
            this_02 = MethodArea::loadClassNamed(local_98,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            goto LAB_00121984;
          }
          bVar1 = false;
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
      } while (bVar1);
      aVar7.longValue._1_7_ = 0;
      aVar7.booleanValue = bVar8;
    }
    else {
      iVar2 = (**((Object *)&(aVar7.object)->_vptr_Object)->_vptr_Object)(aVar7.longValue);
      if (iVar2 == 1) {
        iVar2 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar2 == 0) {
          aVar7.longValue = 1;
          goto LAB_001219b8;
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_70);
      aVar7.longValue._1_7_ = 0;
      aVar7.booleanValue = iVar2 == 0;
    }
  }
LAB_001219b8:
  VVar9.data.longValue = aVar7.longValue;
  VVar9.printType = BOOLEAN;
  VVar9.type = INT;
  Frame::pushIntoOperandStack(this_01,VVar9);
  this_01->pc = this_01->pc + 3;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void ExecutionEngine::i_instanceof() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    MethodArea &methodArea = MethodArea::getInstance();

    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    
    u2 cpIndex = (byte1 << 8) | byte2;
    cp_info *constantPool = *(topFrame->getConstantPool());
    cp_info cpElement = constantPool[cpIndex-1];
    assert(cpElement.tag == CONSTANT_Class);
    string className = getFormattedConstant(constantPool, cpIndex);
    
    Value objectrefValue = topFrame->popTopOfOperandStack();
    assert(objectrefValue.type == ValueType::REFERENCE);
    
    Value resultValue;
    resultValue.type = ValueType::INT;

    if (objectrefValue.data.object == NULL) {
        resultValue.data.intValue = 0;
    } else {
        Object *obj = objectrefValue.data.object;
        
        if (obj->objectType() == ObjectType::CLASS_INSTANCE) {
            ClassInstance *classInstance = (ClassInstance *) obj;
            ClassRuntime *classRuntime = classInstance->getClassRuntime();
            
            bool found = false;
            while (!found) {
                ClassFile *classFile = classRuntime->getClassFile();
                string currClassName = getFormattedConstant(classFile->constant_pool, classFile->this_class);
                
                if (currClassName == className) {
                    found = true;
                } else {
                    if (classFile->super_class == 0) {
                        break;
                    } else {
                        string superClassName = getFormattedConstant(classFile->constant_pool, classFile->this_class);
                        classRuntime = methodArea.loadClassNamed(superClassName);
                    }
                }
            }
            
            resultValue.data.intValue = found ? 1 : 0;
        } else if (obj->objectType() == ObjectType::STRING_INSTANCE) {
            resultValue.data.intValue = (className == "java/lang/String" || className == "java/lang/Object") ? 1 : 0;
        } else {
            if (className == "java/lang/Object") {
                resultValue.data.intValue = 1;
            } else {
                resultValue.data.intValue = 0;
            }
        }
    }
    
    topFrame->pushIntoOperandStack(resultValue);
    
    topFrame->pc += 3;
}